

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt,int extra)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((ctxt != (xmlSaveCtxtPtr)0x0) && (ctxt->buf != (xmlOutputBufferPtr)0x0)) {
    xmlOutputBufferWrite(ctxt->buf,1,"\n");
    for (iVar3 = 0; iVar1 = ctxt->level + extra, iVar2 = iVar1 - iVar3, iVar2 != 0 && iVar3 <= iVar1
        ; iVar3 = iVar3 + ctxt->indent_nr) {
      iVar1 = ctxt->indent_nr;
      if (iVar2 < ctxt->indent_nr) {
        iVar1 = iVar2;
      }
      xmlOutputBufferWrite(ctxt->buf,iVar1 * ctxt->indent_size,ctxt->indent);
    }
  }
  return;
}

Assistant:

static void
xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt, int extra)
{
    int i;
    if ((ctxt == NULL) || (ctxt->buf == NULL))
        return;
    xmlOutputBufferWrite(ctxt->buf, 1, "\n");
    for (i = 0; i < (ctxt->level + extra); i += ctxt->indent_nr) {
        xmlOutputBufferWrite(ctxt->buf, ctxt->indent_size *
                ((ctxt->level + extra - i) > ctxt->indent_nr ?
                 ctxt->indent_nr : (ctxt->level + extra - i)),
                ctxt->indent);
    }
}